

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveEntityReliablePdu.cpp
# Opt level: O2

bool __thiscall
DIS::RemoveEntityReliablePdu::operator==(RemoveEntityReliablePdu *this,RemoveEntityReliablePdu *rhs)

{
  bool bVar1;
  
  bVar1 = SimulationManagementWithReliabilityFamilyPdu::operator==
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                     &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  return ((bVar1 && this->_requiredReliabilityService == rhs->_requiredReliabilityService) &&
         this->_pad1 == rhs->_pad1) &&
         (this->_requestID == rhs->_requestID && this->_pad2 == rhs->_pad2);
}

Assistant:

bool RemoveEntityReliablePdu::operator ==(const RemoveEntityReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_requiredReliabilityService == rhs._requiredReliabilityService) ) ivarsEqual = false;
     if( ! (_pad1 == rhs._pad1) ) ivarsEqual = false;
     if( ! (_pad2 == rhs._pad2) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }